

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void sortScripts(vector<chatra::Script,_std::allocator<chatra::Script>_> *scripts)

{
  long lVar1;
  ulong uVar2;
  vector<chatra::Script,_std::allocator<chatra::Script>_> *in_RSI;
  __normal_iterator<chatra::Script_*,_std::vector<chatra::Script,_std::allocator<chatra::Script>_>_>
  __i;
  pointer *ppSVar3;
  
  if (scripts != in_RSI) {
    uVar2 = (long)in_RSI - (long)scripts >> 6;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
              (scripts,in_RSI,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)in_RSI - (long)scripts < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
                (scripts);
      return;
    }
    ppSVar3 = &scripts[0x2a].super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    __insertion_sort<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Iter_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
              (scripts,ppSVar3);
    for (; (vector<chatra::Script,_std::allocator<chatra::Script>_> *)ppSVar3 != in_RSI;
        ppSVar3 = ppSVar3 + 8) {
      std::
      __unguarded_linear_insert<__gnu_cxx::__normal_iterator<chatra::Script*,std::vector<chatra::Script,std::allocator<chatra::Script>>>,__gnu_cxx::__ops::_Val_comp_iter<sortScripts(std::vector<chatra::Script,std::allocator<chatra::Script>>&)::__0>>
                (ppSVar3);
    }
  }
  return;
}

Assistant:

static void sortScripts(std::vector<cha::Script>& scripts) {
	std::sort(scripts.begin(), scripts.end(), [](const cha::Script& a, const cha::Script& b) {
		return a.name < b.name;
	});
}